

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O1

ares_status_t ares_sortaddrinfo(ares_channel_t *channel,ares_addrinfo_node *list_sentinel)

{
  long *plVar1;
  ushort uVar2;
  sockaddr *addr;
  _func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *p_Var3;
  long lVar4;
  bool bVar5;
  ares_channel_t *channel_00;
  long *p;
  undefined4 uVar6;
  ares_conn_err_t aVar7;
  int iVar8;
  ares_addrinfo_node *paVar9;
  long *plVar10;
  long lVar11;
  ares_status_t aVar12;
  size_t __nmemb;
  undefined4 uVar13;
  ares_addrinfo_node **ppaVar14;
  size_t sVar15;
  ares_socket_t sock;
  ares_socket_t local_50;
  ares_socklen_t local_4c;
  ares_channel_t *local_48;
  long *local_40;
  ares_addrinfo_node **local_38;
  
  __nmemb = 0;
  for (paVar9 = list_sentinel->ai_next; paVar9 != (ares_addrinfo_node *)0x0;
      paVar9 = paVar9->ai_next) {
    __nmemb = __nmemb + 1;
  }
  if (__nmemb == 0) {
    aVar12 = ARES_ENODATA;
  }
  else {
    plVar10 = (long *)ares_malloc(__nmemb * 0x30);
    if (plVar10 == (long *)0x0) {
      aVar12 = ARES_ENOMEM;
    }
    else {
      ppaVar14 = &list_sentinel->ai_next;
      sVar15 = 0;
      local_48 = channel;
      local_40 = plVar10;
      local_38 = ppaVar14;
      do {
        paVar9 = *ppaVar14;
        if (paVar9 == (ares_addrinfo_node *)0x0) {
          __assert_fail("cur != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/c-ares[P]c-ares/src/lib/ares_sortaddrinfo.c"
                        ,0x1a7,
                        "ares_status_t ares_sortaddrinfo(ares_channel_t *, struct ares_addrinfo_node *)"
                       );
        }
        *plVar10 = (long)paVar9;
        plVar10[5] = sVar15;
        addr = paVar9->ai_addr;
        uVar2 = addr->sa_family;
        if (uVar2 == 2) {
          local_4c = 0x10;
LAB_00116f31:
          aVar7 = ares_socket_open(&local_50,local_48,(uint)uVar2,2,0x11);
          uVar13 = 0;
          if (aVar7 == ARES_CONN_ERR_SUCCESS) {
            aVar7 = ares_socket_connect(local_48,local_50,ARES_FALSE,addr,local_4c);
            channel_00 = local_48;
            if (aVar7 < ARES_CONN_ERR_CONNCLOSED) {
              p_Var3 = (local_48->sock_funcs).agetsockname;
              if ((p_Var3 == (_func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *)0x0
                  ) || (iVar8 = (*p_Var3)(local_50,(sockaddr *)((long)plVar10 + 0xc),&local_4c,
                                          local_48->sock_func_cb_data), iVar8 != 0)) {
                ares_socket_close(channel_00,local_50);
                goto LAB_00116fc8;
              }
              ares_socket_close(channel_00,local_50);
              uVar6 = 1;
              goto LAB_00116f5b;
            }
            ares_socket_close(local_48,local_50);
            bVar5 = false;
            uVar13 = 0;
          }
          else {
            uVar6 = 0;
            if (aVar7 == ARES_CONN_ERR_AFNOSUPPORT) {
LAB_00116f5b:
              uVar13 = uVar6;
              bVar5 = false;
            }
            else {
LAB_00116fc8:
              bVar5 = true;
            }
          }
        }
        else {
          bVar5 = false;
          uVar13 = 0;
          if (uVar2 == 10) {
            local_4c = 0x1c;
            goto LAB_00116f31;
          }
        }
        p = local_40;
        if (bVar5) {
          aVar12 = ARES_ENOTFOUND;
          goto LAB_00117075;
        }
        *(undefined4 *)(plVar10 + 1) = uVar13;
        sVar15 = sVar15 + 1;
        ppaVar14 = &paVar9->ai_next;
        plVar10 = plVar10 + 6;
      } while (__nmemb != sVar15);
      qsort(local_40,__nmemb,0x30,rfc6724_compare);
      *local_38 = (ares_addrinfo_node *)*p;
      plVar10 = p;
      for (lVar11 = __nmemb - 1; lVar11 != 0; lVar11 = lVar11 + -1) {
        lVar4 = *plVar10;
        plVar1 = plVar10 + 6;
        plVar10 = plVar10 + 6;
        *(long *)(lVar4 + 0x20) = *plVar1;
      }
      *(undefined8 *)(p[(__nmemb - 1) * 6] + 0x20) = 0;
      aVar12 = ARES_SUCCESS;
LAB_00117075:
      ares_free(p);
    }
  }
  return aVar12;
}

Assistant:

ares_status_t ares_sortaddrinfo(ares_channel_t            *channel,
                                struct ares_addrinfo_node *list_sentinel)
{
  struct ares_addrinfo_node *cur;
  size_t                     nelem = 0;
  size_t                     i;
  int                        has_src_addr;
  struct addrinfo_sort_elem *elems;

  cur = list_sentinel->ai_next;
  while (cur) {
    ++nelem;
    cur = cur->ai_next;
  }

  if (!nelem) {
    return ARES_ENODATA;
  }

  elems = (struct addrinfo_sort_elem *)ares_malloc(
    nelem * sizeof(struct addrinfo_sort_elem));
  if (!elems) {
    return ARES_ENOMEM;
  }

  /*
   * Convert the linked list to an array that also contains the candidate
   * source address for each destination address.
   */
  for (i = 0, cur = list_sentinel->ai_next; i < nelem;
       ++i, cur   = cur->ai_next) {
    assert(cur != NULL);
    elems[i].ai             = cur;
    elems[i].original_order = i;
    has_src_addr = find_src_addr(channel, cur->ai_addr, &elems[i].src_addr.sa);
    if (has_src_addr == -1) {
      ares_free(elems);
      return ARES_ENOTFOUND;
    }
    elems[i].has_src_addr = (has_src_addr == 1) ? ARES_TRUE : ARES_FALSE;
  }

  /* Sort the addresses, and rearrange the linked list so it matches the sorted
   * order. */
  qsort((void *)elems, nelem, sizeof(struct addrinfo_sort_elem),
        rfc6724_compare);

  list_sentinel->ai_next = elems[0].ai;
  for (i = 0; i < nelem - 1; ++i) {
    elems[i].ai->ai_next = elems[i + 1].ai;
  }
  elems[nelem - 1].ai->ai_next = NULL;

  ares_free(elems);
  return ARES_SUCCESS;
}